

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInfo.h
# Opt level: O0

void __thiscall HighsInfo::initRecords(HighsInfo *this)

{
  void *pvVar1;
  InfoRecordDouble *this_00;
  bool advanced;
  InfoRecordDouble *record_double;
  InfoRecordInt *record_int;
  InfoRecordInt64 *record_int64;
  value_type *in_stack_fffffffffffff618;
  vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *in_stack_fffffffffffff620;
  allocator *this_01;
  double in_stack_fffffffffffff678;
  allocator *Xdefault_value;
  double *in_stack_fffffffffffff680;
  allocator *Xvalue_pointer;
  undefined8 in_stack_fffffffffffff688;
  undefined1 uVar2;
  string *in_stack_fffffffffffff690;
  string *Xdescription;
  string *in_stack_fffffffffffff698;
  string *Xname;
  InfoRecordDouble *in_stack_fffffffffffff6a0;
  allocator local_7b9;
  string local_7b8 [39];
  allocator local_791;
  string local_790 [32];
  void *local_770;
  undefined1 local_762;
  allocator local_761;
  string local_760 [39];
  allocator local_739;
  string local_738 [32];
  void *local_718;
  undefined1 local_70a;
  allocator local_709;
  string local_708 [39];
  allocator local_6e1;
  string local_6e0 [32];
  void *local_6c0;
  undefined1 local_6b2;
  allocator local_6b1;
  string local_6b0 [39];
  allocator local_689;
  string local_688 [32];
  void *local_668;
  undefined1 local_65a;
  allocator local_659;
  string local_658 [39];
  undefined1 local_631 [33];
  InfoRecordDouble *local_610;
  undefined1 local_602;
  undefined1 local_601 [40];
  allocator local_5d9;
  string local_5d8 [32];
  void *local_5b8;
  undefined1 local_5aa;
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [32];
  void *local_560;
  undefined1 local_552;
  allocator local_551;
  string local_550 [39];
  allocator local_529;
  string local_528 [32];
  void *local_508;
  undefined1 local_4fa;
  allocator local_4f9;
  string local_4f8 [39];
  allocator local_4d1;
  string local_4d0 [32];
  void *local_4b0;
  undefined1 local_4a2;
  allocator local_4a1;
  string local_4a0 [39];
  allocator local_479;
  string local_478 [32];
  void *local_458;
  undefined1 local_44a;
  allocator local_449;
  string local_448 [39];
  allocator local_421;
  string local_420 [32];
  void *local_400;
  undefined1 local_3f2;
  allocator local_3f1;
  string local_3f0 [39];
  allocator local_3c9;
  string local_3c8 [32];
  void *local_3a8;
  undefined1 local_39a;
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [32];
  void *local_350;
  undefined1 local_342;
  allocator local_341;
  string local_340 [39];
  allocator local_319;
  string local_318 [32];
  void *local_2f8;
  undefined1 local_2ea;
  allocator local_2e9;
  string local_2e8 [39];
  allocator local_2c1;
  string local_2c0 [32];
  void *local_2a0;
  undefined1 local_292;
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [32];
  void *local_248;
  undefined1 local_23a;
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  void *local_1f0;
  undefined1 local_1e2;
  allocator local_1e1;
  string local_1e0 [39];
  allocator local_1b9;
  string local_1b8 [32];
  void *local_198;
  undefined1 local_18a;
  allocator local_189;
  string local_188 [39];
  allocator local_161;
  string local_160 [32];
  void *local_140;
  undefined1 local_132;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  void *local_e8;
  undefined1 local_da;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [32];
  void *local_90;
  undefined1 local_82;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [39];
  undefined1 local_21;
  void *local_20;
  InfoRecordDouble *local_18;
  void *local_10;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffff688 >> 0x38);
  local_21 = 0;
  pvVar1 = operator_new(0x68);
  local_82 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"simplex_iteration_count",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Iteration count for simplex solver",&local_81);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_82 = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  local_90 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_da = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"ipm_iteration_count",&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"Iteration count for IPM solver",&local_d9);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_da = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  local_e8 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_132 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"crossover_iteration_count",&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"Iteration count for crossover",&local_131);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_132 = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  local_140 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_18a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_160,"pdlp_iteration_count",&local_161);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_188,"Iteration count for PDLP solver",&local_189);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_18a = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_188);
  std::allocator<char>::~allocator((allocator<char> *)&local_189);
  std::__cxx11::string::~string(local_160);
  std::allocator<char>::~allocator((allocator<char> *)&local_161);
  local_198 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_1e2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,"qp_iteration_count",&local_1b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e0,"Iteration count for QP solver",&local_1e1);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_1e2 = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_1e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e1);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
  local_1f0 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_23a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"primal_solution_status",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_238,
             "Model primal solution status: 0 => No solution; 1 => Infeasible point; 2 => Feasible point"
             ,&local_239);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_23a = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  local_248 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_292 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"dual_solution_status",&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_290,
             "Model dual solution status: 0 => No solution; 1 => Infeasible point; 2 => Feasible point"
             ,&local_291);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_292 = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  local_2a0 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_2ea = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c0,"basis_validity",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2e8,"Model basis validity: 0 => Invalid; 1 => Valid",&local_2e9);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_2ea = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_2e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  std::__cxx11::string::~string(local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  local_2f8 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_342 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"objective_function_value",&local_319);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_340,"Objective function value",&local_341);
  InfoRecordDouble::InfoRecordDouble
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (bool)uVar2,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_342 = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_340);
  std::allocator<char>::~allocator((allocator<char> *)&local_341);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  local_350 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_39a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"mip_node_count",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"MIP solver node count",&local_399);
  InfoRecordInt64::InfoRecordInt64
            ((InfoRecordInt64 *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(int64_t *)in_stack_fffffffffffff680,
             (int64_t)in_stack_fffffffffffff678);
  local_39a = 0;
  local_10 = pvVar1;
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  local_3a8 = local_10;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_3f2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3c8,"mip_dual_bound",&local_3c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3f0,"MIP solver dual bound",&local_3f1);
  InfoRecordDouble::InfoRecordDouble
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (bool)uVar2,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_3f2 = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f1);
  std::__cxx11::string::~string(local_3c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3c9);
  local_400 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_44a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_420,"mip_gap",&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"MIP solver gap (%)",&local_449);
  InfoRecordDouble::InfoRecordDouble
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (bool)uVar2,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_44a = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::__cxx11::string::~string(local_420);
  std::allocator<char>::~allocator((allocator<char> *)&local_421);
  local_458 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_4a2 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_478,"max_integrality_violation",&local_479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"Max integrality violation",&local_4a1);
  InfoRecordDouble::InfoRecordDouble
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (bool)uVar2,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_4a2 = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::__cxx11::string::~string(local_478);
  std::allocator<char>::~allocator((allocator<char> *)&local_479);
  local_4b0 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_4fa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4d0,"num_primal_infeasibilities",&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f8,"Number of primal infeasibilities",&local_4f9);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,
             in_stack_fffffffffffff690,(bool)uVar2,(HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_4fa = 0;
  local_18 = (InfoRecordDouble *)pvVar1;
  std::__cxx11::string::~string(local_4f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f9);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  local_508 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_552 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_528,"max_primal_infeasibility",&local_529);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_550,"Maximum primal infeasibility",&local_551);
  InfoRecordDouble::InfoRecordDouble
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (bool)uVar2,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_552 = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_550);
  std::allocator<char>::~allocator((allocator<char> *)&local_551);
  std::__cxx11::string::~string(local_528);
  std::allocator<char>::~allocator((allocator<char> *)&local_529);
  local_560 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_5aa = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"sum_primal_infeasibilities",&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"Sum of primal infeasibilities",&local_5a9);
  InfoRecordDouble::InfoRecordDouble
            (in_stack_fffffffffffff6a0,in_stack_fffffffffffff698,in_stack_fffffffffffff690,
             (bool)uVar2,in_stack_fffffffffffff680,in_stack_fffffffffffff678);
  local_5aa = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  local_5b8 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  this_00 = (InfoRecordDouble *)operator_new(0x68);
  local_602 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5d8,"num_dual_infeasibilities",&local_5d9);
  Xname = (string *)local_601;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_601 + 1),"Number of dual infeasibilities",(allocator *)Xname);
  InfoRecordInt::InfoRecordInt
            ((InfoRecordInt *)this_00,Xname,in_stack_fffffffffffff690,(bool)uVar2,
             (HighsInt *)in_stack_fffffffffffff680,
             (HighsInt)((ulong)in_stack_fffffffffffff678 >> 0x20));
  local_602 = 0;
  local_18 = this_00;
  std::__cxx11::string::~string((string *)(local_601 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_601);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d9);
  local_610 = local_18;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_65a = 1;
  Xdescription = (string *)local_631;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_631 + 1),"max_dual_infeasibility",(allocator *)Xdescription);
  Xvalue_pointer = &local_659;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_658,"Maximum dual infeasibility",Xvalue_pointer);
  InfoRecordDouble::InfoRecordDouble
            (this_00,Xname,Xdescription,SUB81((ulong)pvVar1 >> 0x38,0),(double *)Xvalue_pointer,
             in_stack_fffffffffffff678);
  local_65a = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_658);
  uVar2 = (undefined1)((ulong)pvVar1 >> 0x38);
  std::allocator<char>::~allocator((allocator<char> *)&local_659);
  std::__cxx11::string::~string((string *)(local_631 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_631);
  local_668 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_6b2 = 1;
  Xdefault_value = &local_689;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_688,"sum_dual_infeasibilities",Xdefault_value);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6b0,"Sum of dual infeasibilities",&local_6b1);
  InfoRecordDouble::InfoRecordDouble
            (this_00,Xname,Xdescription,(bool)uVar2,(double *)Xvalue_pointer,(double)Xdefault_value)
  ;
  local_6b2 = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_6b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  std::__cxx11::string::~string(local_688);
  std::allocator<char>::~allocator((allocator<char> *)&local_689);
  local_6c0 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_70a = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"max_complementarity_violation",&local_6e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_708,"Max complementarity violation",&local_709);
  InfoRecordDouble::InfoRecordDouble
            (this_00,Xname,Xdescription,(bool)uVar2,(double *)Xvalue_pointer,(double)Xdefault_value)
  ;
  local_70a = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_708);
  std::allocator<char>::~allocator((allocator<char> *)&local_709);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  local_718 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  local_762 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_738,"sum_complementarity_violations",&local_739);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_760,"Sum of complementarity violations",&local_761);
  InfoRecordDouble::InfoRecordDouble
            (this_00,Xname,Xdescription,(bool)uVar2,(double *)Xvalue_pointer,(double)Xdefault_value)
  ;
  local_762 = 0;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_760);
  std::allocator<char>::~allocator((allocator<char> *)&local_761);
  std::__cxx11::string::~string(local_738);
  std::allocator<char>::~allocator((allocator<char> *)&local_739);
  local_770 = local_20;
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            (in_stack_fffffffffffff620,in_stack_fffffffffffff618);
  pvVar1 = operator_new(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_790,"primal_dual_integral",&local_791);
  this_01 = &local_7b9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b8,"Primal-dual integral",this_01);
  InfoRecordDouble::InfoRecordDouble
            (this_00,Xname,Xdescription,(bool)uVar2,(double *)Xvalue_pointer,(double)Xdefault_value)
  ;
  local_20 = pvVar1;
  std::__cxx11::string::~string(local_7b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b9);
  std::__cxx11::string::~string(local_790);
  std::allocator<char>::~allocator((allocator<char> *)&local_791);
  std::vector<InfoRecord_*,_std::allocator<InfoRecord_*>_>::push_back
            ((vector<InfoRecord_*,_std::allocator<InfoRecord_*>_> *)this_01,
             in_stack_fffffffffffff618);
  return;
}

Assistant:

void initRecords() {
    InfoRecordInt64* record_int64;
    InfoRecordInt* record_int;
    InfoRecordDouble* record_double;
    const bool advanced = false;  // Not used

    record_int = new InfoRecordInt("simplex_iteration_count",
                                   "Iteration count for simplex solver",
                                   advanced, &simplex_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("ipm_iteration_count",
                                   "Iteration count for IPM solver", advanced,
                                   &ipm_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("crossover_iteration_count",
                                   "Iteration count for crossover", advanced,
                                   &crossover_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("pdlp_iteration_count",
                                   "Iteration count for PDLP solver", advanced,
                                   &pdlp_iteration_count, 0);
    records.push_back(record_int);

    record_int =
        new InfoRecordInt("qp_iteration_count", "Iteration count for QP solver",
                          advanced, &qp_iteration_count, 0);
    records.push_back(record_int);

    record_int = new InfoRecordInt("primal_solution_status",
                                   "Model primal solution status: 0 => No "
                                   "solution; 1 => Infeasible point; "
                                   "2 => Feasible point",
                                   advanced, &primal_solution_status,
                                   kSolutionStatusNone);
    records.push_back(record_int);

    record_int =
        new InfoRecordInt("dual_solution_status",
                          "Model dual solution status: 0 => No solution; 1 => "
                          "Infeasible point; 2 "
                          "=> Feasible point",
                          advanced, &dual_solution_status, kSolutionStatusNone);
    records.push_back(record_int);

    record_int = new InfoRecordInt(
        "basis_validity", "Model basis validity: 0 => Invalid; 1 => Valid",
        advanced, &basis_validity, kBasisValidityInvalid);
    records.push_back(record_int);

    record_double = new InfoRecordDouble("objective_function_value",
                                         "Objective function value", advanced,
                                         &objective_function_value, 0);
    records.push_back(record_double);

    record_int64 =
        new InfoRecordInt64("mip_node_count", "MIP solver node count", advanced,
                            &mip_node_count, 0);
    records.push_back(record_int64);

    record_double =
        new InfoRecordDouble("mip_dual_bound", "MIP solver dual bound",
                             advanced, &mip_dual_bound, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble("mip_gap", "MIP solver gap (%)",
                                         advanced, &mip_gap, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble("max_integrality_violation",
                                         "Max integrality violation", advanced,
                                         &max_integrality_violation, 0);
    records.push_back(record_double);

    record_int = new InfoRecordInt("num_primal_infeasibilities",
                                   "Number of primal infeasibilities", advanced,
                                   &num_primal_infeasibilities, -1);
    records.push_back(record_int);

    record_double = new InfoRecordDouble(
        "max_primal_infeasibility", "Maximum primal infeasibility", advanced,
        &max_primal_infeasibility, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_primal_infeasibilities", "Sum of primal infeasibilities", advanced,
        &sum_primal_infeasibilities, 0);
    records.push_back(record_double);

    record_int = new InfoRecordInt("num_dual_infeasibilities",
                                   "Number of dual infeasibilities", advanced,
                                   &num_dual_infeasibilities, -1);
    records.push_back(record_int);

    record_double = new InfoRecordDouble("max_dual_infeasibility",
                                         "Maximum dual infeasibility", advanced,
                                         &max_dual_infeasibility, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_dual_infeasibilities", "Sum of dual infeasibilities", advanced,
        &sum_dual_infeasibilities, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "max_complementarity_violation", "Max complementarity violation",
        advanced, &max_complementarity_violation, 0);
    records.push_back(record_double);

    record_double = new InfoRecordDouble(
        "sum_complementarity_violations", "Sum of complementarity violations",
        advanced, &sum_complementarity_violations, 0);
    records.push_back(record_double);

    record_double =
        new InfoRecordDouble("primal_dual_integral", "Primal-dual integral",
                             advanced, &primal_dual_integral, 0);
    records.push_back(record_double);
  }